

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi_uc *psVar1;
  anon_struct_96_18_0d0905d3 *paVar2;
  stbi_uc sVar3;
  uchar uVar4;
  short sVar5;
  ushort uVar6;
  stbi_uc asVar7 [4];
  stbi_uc asVar8 [4];
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  byte bVar12;
  short sVar13;
  stbi__uint32 *psVar14;
  stbi__uint32 *psVar15;
  undefined4 uVar16;
  stbi_uc sVar17;
  byte bVar18;
  char cVar19;
  stbi__uint16 sVar20;
  int iVar21;
  stbi__uint32 sVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  stbi__jpeg *psVar28;
  char *pcVar29;
  stbi__context *data_00;
  stbi__context *psVar30;
  float *data_01;
  stbi_uc *psVar31;
  uchar *data_02;
  void *pvVar32;
  code *pcVar33;
  stbi__context *psVar34;
  stbi__uint16 *data_03;
  uchar *puVar35;
  long lVar36;
  long lVar37;
  byte *pbVar38;
  ulong uVar39;
  uint uVar40;
  int why;
  int why_00;
  uint uVar41;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  stbi_uc *psVar42;
  stbi_uc *extraout_RDX_11;
  stbi_uc *extraout_RDX_12;
  stbi__uint32 sVar43;
  stbi_uc *psVar44;
  byte *pbVar45;
  stbi__uint16 *psVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  short sVar50;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  anon_struct_96_18_0d0905d3 *paVar54;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar55;
  short *psVar56;
  ulong uVar57;
  int *piVar58;
  ulong uVar59;
  uint uVar60;
  ulong uVar61;
  stbi_uc (*pasVar62) [4];
  stbi__uint16 *psVar63;
  long in_FS_OFFSET;
  bool bVar64;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  float fVar76;
  float fVar77;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 in_register_000014c4 [12];
  undefined1 auVar85 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_89f8;
  int local_89dc;
  uint local_89cc;
  stbi__uint16 *local_89c8;
  stbi__uint16 *local_89b8;
  undefined1 local_8998 [8];
  undefined8 uStack_8990;
  undefined8 uStack_8988;
  undefined8 uStack_8980;
  int local_8978;
  ulong local_8968;
  undefined8 local_8960;
  undefined8 local_8958;
  stbi__uint32 *local_8950;
  stbi__uint32 *local_8948;
  int *local_8940;
  undefined1 local_8938 [64];
  uint local_88ec;
  undefined1 local_88e8 [64];
  stbi__gif local_88a8;
  undefined1 auVar78 [16];
  
  psVar31 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  local_8938._0_4_ = bpc;
  ri_00 = ri;
  local_8950 = (stbi__uint32 *)x;
  local_8948 = (stbi__uint32 *)y;
  local_8940 = comp;
  psVar28 = (stbi__jpeg *)malloc(0x4888);
  psVar28->s = s;
  psVar28->idct_block_kernel = stbi__idct_simd;
  psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar28->jfif = 0;
  psVar28->app14_color_transform = -1;
  psVar28->marker = 0xff;
  sVar17 = stbi__get_marker(psVar28);
  if (sVar17 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0xb0) = "no SOI";
  }
  psVar42 = s->img_buffer_original;
  psVar44 = s->img_buffer_original_end;
  s->img_buffer = psVar42;
  s->img_buffer_end = psVar44;
  free(psVar28);
  if (sVar17 == 0xd8) {
    psVar28 = (stbi__jpeg *)malloc(0x4888);
    psVar28->s = s;
    psVar28->idct_block_kernel = stbi__idct_simd;
    psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar28->img_comp[0].raw_data = (void *)0x0;
      psVar28->img_comp[0].raw_coeff = (void *)0x0;
      psVar28->img_comp[1].raw_data = (void *)0x0;
      psVar28->img_comp[1].raw_coeff = (void *)0x0;
      psVar28->img_comp[2].raw_data = (void *)0x0;
      psVar28->img_comp[2].raw_coeff = (void *)0x0;
      psVar28->img_comp[3].raw_data = (void *)0x0;
      psVar28->img_comp[3].raw_coeff = (void *)0x0;
      psVar28->restart_interval = 0;
      iVar21 = stbi__decode_jpeg_header(psVar28,0);
      uVar57 = extraout_RDX;
      if (iVar21 != 0) {
        paVar2 = psVar28->img_comp;
        bVar18 = stbi__get_marker(psVar28);
        local_8938._0_8_ = psVar28->huff_dc;
        local_88e8._0_8_ = psVar28->huff_ac;
LAB_0048f6c0:
        if (bVar18 == 0xda) {
          iVar21 = stbi__get16be(psVar28->s);
          psVar30 = psVar28->s;
          pbVar45 = psVar30->img_buffer;
          uVar57 = extraout_RDX_02;
          if (psVar30->img_buffer_end <= pbVar45) {
            if (psVar30->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar30);
              pbVar45 = psVar30->img_buffer;
              uVar57 = extraout_RDX_03;
              goto LAB_0048f75e;
            }
            psVar28->scan_n = 0;
LAB_0049100d:
            pcVar29 = "bad SOS component count";
            goto LAB_00491014;
          }
LAB_0048f75e:
          psVar30->img_buffer = pbVar45 + 1;
          bVar18 = *pbVar45;
          psVar28->scan_n = (uint)bVar18;
          if (((byte)(bVar18 - 5) < 0xfc) ||
             (psVar30 = psVar28->s, psVar30->img_n < (int)(uint)bVar18)) goto LAB_0049100d;
          if (iVar21 != bVar18 + 6 + (uint)bVar18) {
            pcVar29 = "bad SOS len";
            goto LAB_00491014;
          }
          lVar37 = 0;
          psVar34 = psVar30;
          do {
            pbVar38 = psVar34->img_buffer;
            pbVar45 = psVar34->img_buffer_end;
            if (pbVar38 < pbVar45) {
LAB_0048f7ce:
              psVar34->img_buffer = pbVar38 + 1;
              uVar60 = (uint)*pbVar38;
              pbVar38 = psVar30->img_buffer;
              pbVar45 = psVar30->img_buffer_end;
              psVar34 = psVar30;
            }
            else {
              if (psVar34->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar34);
                pbVar38 = psVar34->img_buffer;
                psVar30 = psVar28->s;
                goto LAB_0048f7ce;
              }
              uVar60 = 0;
            }
            if (pbVar38 < pbVar45) {
LAB_0048f80f:
              psVar34->img_buffer = pbVar38 + 1;
              bVar18 = *pbVar38;
              psVar34 = psVar30;
            }
            else {
              if (psVar34->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar34);
                pbVar38 = psVar34->img_buffer;
                psVar30 = psVar28->s;
                goto LAB_0048f80f;
              }
              bVar18 = 0;
            }
            iVar21 = psVar34->img_n;
            if ((long)iVar21 < 1) {
              uVar57 = 0;
            }
            else {
              uVar57 = 0;
              paVar54 = paVar2;
              while (paVar54->id != uVar60) {
                uVar57 = uVar57 + 1;
                paVar54 = paVar54 + 1;
                if ((long)iVar21 == uVar57) goto LAB_0049101d;
              }
            }
            if ((int)uVar57 == iVar21) goto LAB_0049101d;
            psVar28->img_comp[uVar57 & 0xffffffff].hd = (uint)(bVar18 >> 4);
            if (0x3f < bVar18) {
              pcVar29 = "bad DC huff";
              goto LAB_00491014;
            }
            paVar2[uVar57 & 0xffffffff].ha = bVar18 & 0xf;
            if (3 < (bVar18 & 0xf)) {
              pcVar29 = "bad AC huff";
              goto LAB_00491014;
            }
            psVar28->order[lVar37] = (int)uVar57;
            lVar37 = lVar37 + 1;
          } while (lVar37 < psVar28->scan_n);
          pbVar38 = psVar34->img_buffer;
          pbVar45 = psVar34->img_buffer_end;
          if (pbVar38 < pbVar45) {
LAB_0048f8df:
            psVar34->img_buffer = pbVar38 + 1;
            uVar60 = (uint)*pbVar38;
            pbVar38 = psVar30->img_buffer;
            pbVar45 = psVar30->img_buffer_end;
            psVar34 = psVar30;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar38 = psVar34->img_buffer;
              psVar30 = psVar28->s;
              goto LAB_0048f8df;
            }
            uVar60 = 0;
          }
          psVar28->spec_start = uVar60;
          if (pbVar38 < pbVar45) {
LAB_0048f928:
            psVar34->img_buffer = pbVar38 + 1;
            uVar60 = (uint)*pbVar38;
            pbVar38 = psVar30->img_buffer;
            pbVar45 = psVar30->img_buffer_end;
            psVar34 = psVar30;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar38 = psVar34->img_buffer;
              psVar30 = psVar28->s;
              goto LAB_0048f928;
            }
            uVar60 = 0;
          }
          psVar28->spec_end = uVar60;
          if (pbVar38 < pbVar45) {
LAB_0048f96d:
            psVar34->img_buffer = pbVar38 + 1;
            uVar60 = (uint)*pbVar38;
          }
          else {
            if (psVar34->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar34);
              pbVar38 = psVar34->img_buffer;
              goto LAB_0048f96d;
            }
            uVar60 = 0;
          }
          uVar49 = uVar60 & 0xf;
          uVar57 = (ulong)uVar49;
          psVar28->succ_high = uVar60 >> 4;
          psVar28->succ_low = uVar49;
          iVar21 = psVar28->progressive;
          iVar25 = psVar28->spec_start;
          if (iVar21 == 0) {
            if (iVar25 != 0 || uVar60 != 0) {
LAB_00491ba1:
              pcVar29 = "bad SOS";
              goto LAB_00491014;
            }
            psVar28->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar25) || (0x3f < psVar28->spec_end)) || (psVar28->spec_end < iVar25))
                  || ((0xdf < uVar60 || (0xd < uVar49)))) goto LAB_00491ba1;
          iVar25 = psVar28->restart_interval;
          uVar60 = psVar28->scan_n;
          uVar57 = (ulong)uVar60;
          psVar28->code_buffer = 0;
          psVar28->code_bits = 0;
          if (iVar25 == 0) {
            iVar25 = 0x7fffffff;
          }
          psVar28->nomore = 0;
          psVar28->img_comp[3].dc_pred = 0;
          psVar28->img_comp[2].dc_pred = 0;
          psVar28->img_comp[1].dc_pred = 0;
          psVar28->img_comp[0].dc_pred = 0;
          psVar28->marker = 0xff;
          psVar28->todo = iVar25;
          psVar28->eob_run = 0;
          if (iVar21 == 0) {
            if (uVar60 == 1) {
              iVar21 = psVar28->order[0];
              bVar64 = true;
              iVar25 = psVar28->img_comp[iVar21].y + 7 >> 3;
              if (0 < iVar25) {
                iVar23 = 0;
                uVar60 = paVar2[iVar21].x + 7 >> 3;
                iVar55 = 0;
                do {
                  if (0 < (int)uVar60) {
                    lVar37 = 0;
                    do {
                      iVar47 = stbi__jpeg_decode_block
                                         (psVar28,(short *)&local_88a8,
                                          (stbi__huffman *)
                                          ((long)paVar2[iVar21].hd * 0x690 + local_8938._0_8_),
                                          (stbi__huffman *)
                                          ((long)paVar2[iVar21].ha * 0x690 + local_88e8._0_8_),
                                          psVar28->fast_ac[paVar2[iVar21].ha],iVar21,
                                          psVar28->dequant[paVar2[iVar21].tq]);
                      uVar57 = extraout_RDX_05;
                      if (iVar47 == 0) goto LAB_004908d8;
                      (*psVar28->idct_block_kernel)
                                (paVar2[iVar21].data + lVar37 + iVar23 * paVar2[iVar21].w2,
                                 paVar2[iVar21].w2,(short *)&local_88a8);
                      iVar47 = psVar28->todo;
                      psVar28->todo = iVar47 + -1;
                      uVar57 = extraout_RDX_06;
                      if (iVar47 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                          uVar57 = extraout_RDX_07;
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_004904a6;
                        psVar28->code_buffer = 0;
                        psVar28->code_bits = 0;
                        psVar28->nomore = 0;
                        psVar28->img_comp[3].dc_pred = 0;
                        psVar28->img_comp[2].dc_pred = 0;
                        psVar28->img_comp[1].dc_pred = 0;
                        psVar28->img_comp[0].dc_pred = 0;
                        psVar28->marker = 0xff;
                        uVar57 = 0x7fffffff;
                        iVar47 = psVar28->restart_interval;
                        if (iVar47 == 0) {
                          iVar47 = 0x7fffffff;
                        }
                        psVar28->todo = iVar47;
                        psVar28->eob_run = 0;
                      }
                      lVar37 = lVar37 + 8;
                    } while ((ulong)uVar60 * 8 != lVar37);
                  }
                  iVar23 = iVar23 + 8;
                  iVar55 = iVar55 + 1;
                } while (iVar55 != iVar25);
LAB_004904a6:
                bVar64 = true;
              }
            }
            else {
              uVar57 = (ulong)(uint)psVar28->img_mcu_y;
              bVar64 = true;
              if (0 < psVar28->img_mcu_y) {
                iVar21 = psVar28->img_mcu_x;
                iVar55 = 0;
                do {
                  if (0 < iVar21) {
                    uVar60 = 0;
                    do {
                      iVar21 = psVar28->scan_n;
                      if (0 < iVar21) {
                        uVar59 = 0;
                        do {
                          iVar25 = psVar28->order[uVar59];
                          iVar23 = psVar28->img_comp[iVar25].v;
                          if (0 < iVar23) {
                            iVar47 = 0;
                            iVar21 = paVar2[iVar25].h;
                            do {
                              if (0 < iVar21) {
                                iVar23 = 0;
                                do {
                                  iVar48 = paVar2[iVar25].v;
                                  iVar24 = stbi__jpeg_decode_block
                                                     (psVar28,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      ((long)paVar2[iVar25].hd * 0x690 +
                                                      local_8938._0_8_),
                                                      (stbi__huffman *)
                                                      ((long)paVar2[iVar25].ha * 0x690 +
                                                      local_88e8._0_8_),
                                                      psVar28->fast_ac[paVar2[iVar25].ha],iVar25,
                                                      psVar28->dequant[paVar2[iVar25].tq]);
                                  uVar57 = extraout_RDX_09;
                                  if (iVar24 == 0) goto LAB_004908d8;
                                  (*psVar28->idct_block_kernel)
                                            (paVar2[iVar25].data +
                                             (long)(int)((iVar21 * uVar60 + iVar23) * 8) +
                                             (long)((iVar48 * iVar55 + iVar47) * paVar2[iVar25].w2 *
                                                   8),paVar2[iVar25].w2,(short *)&local_88a8);
                                  iVar21 = paVar2[iVar25].h;
                                  iVar23 = iVar23 + 1;
                                } while (iVar23 < iVar21);
                                iVar23 = paVar2[iVar25].v;
                              }
                              iVar47 = iVar47 + 1;
                            } while (iVar47 < iVar23);
                            iVar21 = psVar28->scan_n;
                          }
                          uVar59 = uVar59 + 1;
                        } while ((long)uVar59 < (long)iVar21);
                        iVar25 = psVar28->todo;
                        uVar57 = uVar59;
                      }
                      bVar64 = true;
                      psVar28->todo = iVar25 + -1;
                      bVar10 = iVar25 < 2;
                      iVar25 = iVar25 + -1;
                      if (bVar10) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                          uVar57 = extraout_RDX_10;
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_004908da;
                        psVar28->code_buffer = 0;
                        psVar28->code_bits = 0;
                        psVar28->nomore = 0;
                        psVar28->img_comp[3].dc_pred = 0;
                        psVar28->img_comp[2].dc_pred = 0;
                        psVar28->img_comp[1].dc_pred = 0;
                        psVar28->img_comp[0].dc_pred = 0;
                        psVar28->marker = 0xff;
                        iVar25 = psVar28->restart_interval;
                        if (iVar25 == 0) {
                          iVar25 = 0x7fffffff;
                        }
                        psVar28->todo = iVar25;
                        psVar28->eob_run = 0;
                      }
                      iVar21 = psVar28->img_mcu_x;
                      uVar60 = uVar60 + 1;
                      uVar57 = (ulong)uVar60;
                    } while ((int)uVar60 < iVar21);
                    uVar57 = (ulong)(uint)psVar28->img_mcu_y;
                  }
                  bVar64 = true;
                  iVar55 = iVar55 + 1;
                } while (iVar55 < (int)uVar57);
              }
            }
            goto LAB_004908da;
          }
          if (uVar60 == 1) {
            local_8960 = (ulong)psVar28->order[0];
            iVar21 = psVar28->img_comp[local_8960].y + 7 >> 3;
            local_8968 = CONCAT44(local_8968._4_4_,iVar21);
            if (0 < iVar21) {
              local_8958 = paVar2 + local_8960;
              iVar21 = psVar28->img_comp[local_8960].x + 7 >> 3;
              local_89dc = 0;
              do {
                if (0 < iVar21) {
                  iVar25 = 0;
                  do {
                    uVar59 = (ulong)psVar28->spec_start;
                    psVar56 = local_8958->coeff + (local_8958->coeff_w * local_89dc + iVar25) * 0x40
                    ;
                    if (uVar59 == 0) {
                      iVar55 = stbi__jpeg_decode_block_prog_dc
                                         (psVar28,psVar56,
                                          (stbi__huffman *)
                                          ((long)local_8958->hd * 0x690 + local_8938._0_8_),
                                          (int)local_8960);
                      uVar57 = extraout_RDX_04;
                      if (iVar55 == 0) goto LAB_0049101d;
                    }
                    else {
                      lVar36 = (long)local_8958->ha;
                      uVar60 = psVar28->succ_low;
                      iVar55 = psVar28->eob_run;
                      lVar37 = local_88e8._0_8_ + lVar36 * 0x690;
                      if (psVar28->succ_high == 0) {
                        if (iVar55 == 0) {
                          iVar23 = psVar28->code_bits;
                          do {
                            if (iVar23 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar28);
                            }
                            uVar49 = psVar28->code_buffer;
                            uVar57 = (ulong)(uVar49 >> 0x17);
                            uVar41 = (uint)psVar28->fast_ac[lVar36][uVar57];
                            iVar55 = (int)uVar59;
                            if (uVar41 == 0) {
                              if (psVar28->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar28);
                                uVar49 = psVar28->code_buffer;
                                uVar57 = (ulong)(uVar49 >> 0x17);
                              }
                              uVar59 = (ulong)*(byte *)(lVar37 + uVar57);
                              if (uVar59 == 0xff) {
                                uVar57 = 0;
                                do {
                                  uVar59 = uVar57;
                                  uVar57 = uVar59 + 1;
                                } while (psVar28->huff_ac[lVar36].maxcode[uVar59 + 10] <=
                                         uVar49 >> 0x10);
                                iVar23 = psVar28->code_bits;
                                if (uVar57 == 8) goto LAB_004920b3;
                                uVar41 = (int)uVar59 + 10;
                                if (iVar23 < (int)uVar41) goto LAB_004920be;
                                uVar59 = (ulong)(int)((uVar49 >> ((byte)(0x17 - (char)uVar57) & 0x1f
                                                                 ) & stbi__bmask[uVar59 + 10]) +
                                                     psVar28->huff_ac[lVar36].delta[uVar59 + 10]);
                                bVar18 = *(byte *)(lVar37 + 0x500 + uVar59);
                                if ((uVar49 >> ((byte)-bVar18 & 0x1f) & stbi__bmask[bVar18]) !=
                                    (uint)*(ushort *)(lVar37 + 0x200 + uVar59 * 2))
                                goto LAB_00493a8a;
                                sVar22 = uVar49 << (uVar41 & 0x1f);
                                iVar23 = (iVar23 - (int)uVar57) + -9;
                                psVar28->code_bits = iVar23;
                                psVar28->code_buffer = sVar22;
                              }
                              else {
                                bVar18 = *(byte *)(lVar37 + 0x500 + uVar59);
                                uVar57 = (ulong)bVar18;
                                iVar23 = psVar28->code_bits - (uint)bVar18;
                                if (psVar28->code_bits < (int)(uint)bVar18) goto LAB_004920be;
                                sVar22 = uVar49 << (bVar18 & 0x1f);
                                psVar28->code_buffer = sVar22;
                                psVar28->code_bits = iVar23;
                              }
                              bVar18 = *(byte *)(lVar37 + 0x400 + uVar59);
                              uVar41 = bVar18 & 0xf;
                              bVar12 = bVar18 >> 4;
                              uVar49 = (uint)bVar12;
                              if ((bVar18 & 0xf) == 0) {
                                if (bVar18 < 0xf0) {
                                  iVar55 = 1 << uVar49;
                                  psVar28->eob_run = iVar55;
                                  if (0xf < bVar18) {
                                    if (iVar23 < (int)uVar49) {
                                      stbi__grow_buffer_unsafe(psVar28);
                                      sVar22 = psVar28->code_buffer;
                                      iVar23 = psVar28->code_bits;
                                      iVar55 = psVar28->eob_run;
                                    }
                                    uVar60 = sVar22 << bVar12 | sVar22 >> 0x20 - bVar12;
                                    iVar55 = iVar55 + (uVar60 & stbi__bmask[uVar49]);
                                    psVar28->code_buffer = ~stbi__bmask[uVar49] & uVar60;
                                    psVar28->code_bits = iVar23 - uVar49;
                                  }
                                  goto LAB_0048fc4b;
                                }
                                uVar49 = iVar55 + 0x10;
                              }
                              else {
                                lVar52 = (long)iVar55 + (ulong)uVar49;
                                bVar18 = ""[lVar52];
                                if (iVar23 < (int)uVar41) {
                                  stbi__grow_buffer_unsafe(psVar28);
                                  sVar22 = psVar28->code_buffer;
                                  iVar23 = psVar28->code_bits;
                                }
                                iVar23 = iVar23 - uVar41;
                                uVar53 = sVar22 << (sbyte)uVar41 | sVar22 >> 0x20 - (sbyte)uVar41;
                                uVar40 = *(uint *)((long)stbi__bmask + (ulong)(uVar41 * 4));
                                psVar28->code_buffer = ~uVar40 & uVar53;
                                psVar28->code_bits = iVar23;
                                iVar55 = 0;
                                if (-1 < (int)sVar22) {
                                  iVar55 = *(int *)((long)stbi__jbias + (ulong)(uVar41 * 4));
                                }
                                uVar49 = (int)lVar52 + 1;
                                psVar56[bVar18] =
                                     (short)((uVar53 & uVar40) + iVar55 << (uVar60 & 0x1f));
                              }
                            }
                            else {
                              lVar52 = (long)iVar55 + (ulong)(uVar41 >> 4 & 0xf);
                              psVar28->code_buffer = uVar49 << (uVar41 & 0xf);
                              uVar49 = (int)lVar52 + 1;
                              bVar18 = ""[lVar52];
                              iVar23 = psVar28->code_bits - (uVar41 & 0xf);
                              psVar28->code_bits = iVar23;
                              psVar56[bVar18] = (short)((uVar41 >> 8) << (uVar60 & 0x1f));
                            }
                            uVar59 = (ulong)uVar49;
                          } while ((int)uVar49 <= psVar28->spec_end);
                        }
                        else {
LAB_0048fc4b:
                          psVar28->eob_run = iVar55 + -1;
                        }
                      }
                      else if (iVar55 == 0) {
                        iVar47 = 0x10000 << (uVar60 & 0x1f);
                        iVar55 = psVar28->code_bits;
                        do {
                          if (iVar55 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar28);
                          }
                          uVar49 = psVar28->code_buffer;
                          uVar51 = (ulong)*(byte *)(lVar37 + (ulong)(uVar49 >> 0x17));
                          if (uVar51 == 0xff) {
                            uVar57 = 0;
                            do {
                              uVar51 = uVar57;
                              uVar57 = uVar51 + 1;
                            } while (psVar28->huff_ac[lVar36].maxcode[uVar51 + 10] <= uVar49 >> 0x10
                                    );
                            iVar23 = psVar28->code_bits;
                            if (uVar57 == 8) goto LAB_004920b3;
                            uVar41 = (int)uVar51 + 10;
                            if (iVar23 < (int)uVar41) goto LAB_004920be;
                            uVar51 = (ulong)(int)((uVar49 >> ((byte)(0x17 - (char)uVar57) & 0x1f) &
                                                  stbi__bmask[uVar51 + 10]) +
                                                 psVar28->huff_ac[lVar36].delta[uVar51 + 10]);
                            bVar18 = *(byte *)(lVar37 + 0x500 + uVar51);
                            if ((uVar49 >> ((byte)-bVar18 & 0x1f) & stbi__bmask[bVar18]) !=
                                (uint)*(ushort *)(lVar37 + 0x200 + uVar51 * 2)) {
LAB_00493a8a:
                              pbrt::LogFatal<char_const(&)[82]>
                                        (Fatal,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                                         ,0x81a,"Check failed: %s",
                                         (char (*) [82])
                                         "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                        );
                            }
                            sVar22 = uVar49 << (uVar41 & 0x1f);
                            iVar55 = (iVar23 - (int)uVar57) + -9;
                            psVar28->code_bits = iVar55;
                            psVar28->code_buffer = sVar22;
                          }
                          else {
                            bVar18 = *(byte *)(lVar37 + 0x500 + uVar51);
                            uVar57 = (ulong)bVar18;
                            iVar55 = psVar28->code_bits - (uint)bVar18;
                            if (psVar28->code_bits < (int)(uint)bVar18) goto LAB_004920be;
                            sVar22 = uVar49 << (bVar18 & 0x1f);
                            psVar28->code_buffer = sVar22;
                            psVar28->code_bits = iVar55;
                          }
                          uVar57 = (ulong)sVar22;
                          bVar18 = *(byte *)(lVar37 + 0x400 + uVar51);
                          bVar12 = bVar18 >> 4;
                          uVar49 = (uint)bVar12;
                          uVar51 = (ulong)uVar49;
                          if ((bVar18 & 0xf) == 1) {
                            if (iVar55 < 1) {
                              stbi__grow_buffer_unsafe(psVar28);
                              sVar22 = psVar28->code_buffer;
                              iVar55 = psVar28->code_bits;
                            }
                            iVar55 = iVar55 + -1;
                            psVar28->code_buffer = sVar22 * 2;
                            psVar28->code_bits = iVar55;
                            sVar50 = (short)(((int)~sVar22 >> 0x1f | 1U) << (uVar60 & 0x1f));
                            uVar57 = (ulong)(sVar22 * 2);
                          }
                          else {
                            if ((bVar18 & 0xf) != 0) goto LAB_004920be;
                            if (bVar18 < 0xf0) {
                              uVar61 = 0x40;
                              uVar41 = ~(-1 << uVar49);
                              psVar28->eob_run = uVar41;
                              if (0xf < bVar18) {
                                if (iVar55 < (int)uVar49) {
                                  stbi__grow_buffer_unsafe(psVar28);
                                  sVar22 = psVar28->code_buffer;
                                  iVar55 = psVar28->code_bits;
                                  uVar41 = psVar28->eob_run;
                                }
                                iVar55 = iVar55 - uVar49;
                                uVar40 = sVar22 << bVar12 | sVar22 >> 0x20 - bVar12;
                                uVar49 = stbi__bmask[uVar51];
                                uVar53 = ~uVar49 & uVar40;
                                psVar28->code_buffer = uVar53;
                                psVar28->code_bits = iVar55;
                                sVar50 = 0;
                                psVar28->eob_run = (uVar40 & uVar49) + uVar41;
                                uVar57 = (ulong)uVar53;
                                uVar51 = uVar61;
                                goto LAB_0048fe79;
                              }
                            }
                            else {
                              uVar61 = 0xf;
                            }
                            sVar50 = 0;
                            uVar51 = uVar61;
                          }
LAB_0048fe79:
                          uVar49 = psVar28->spec_end;
                          uVar61 = (ulong)uVar49;
                          if ((int)uVar59 <= (int)uVar49) {
                            uVar39 = (long)(int)uVar59;
                            do {
                              sVar22 = (stbi__uint32)uVar57;
                              uVar49 = (uint)uVar61;
                              bVar18 = ""[uVar39];
                              if (psVar56[bVar18] == 0) {
                                if ((int)uVar51 == 0) {
                                  uVar59 = (ulong)((int)uVar39 + 1);
                                  psVar56[bVar18] = sVar50;
                                  break;
                                }
                                uVar51 = (ulong)((int)uVar51 - 1);
                              }
                              else {
                                if (iVar55 < 1) {
                                  stbi__grow_buffer_unsafe(psVar28);
                                  sVar22 = psVar28->code_buffer;
                                  iVar55 = psVar28->code_bits;
                                }
                                uVar57 = (ulong)(sVar22 * 2);
                                iVar55 = iVar55 + -1;
                                psVar28->code_buffer = sVar22 * 2;
                                psVar28->code_bits = iVar55;
                                if (((int)sVar22 < 0) &&
                                   (sVar5 = psVar56[bVar18], (iVar47 >> 0x10 & (int)sVar5) == 0)) {
                                  sVar13 = (short)((uint)iVar47 >> 0x10);
                                  if (sVar5 < 1) {
                                    sVar13 = -sVar13;
                                  }
                                  psVar56[bVar18] = sVar5 + sVar13;
                                }
                              }
                              uVar49 = psVar28->spec_end;
                              uVar61 = (ulong)(int)uVar49;
                              uVar59 = uVar39 + 1;
                              bVar64 = (long)uVar39 < (long)uVar61;
                              uVar39 = uVar59;
                            } while (bVar64);
                          }
                        } while ((int)uVar59 <= (int)uVar49);
                      }
                      else {
                        psVar28->eob_run = iVar55 + -1;
                        if (psVar28->spec_start <= psVar28->spec_end) {
                          uVar60 = (0x10000 << (uVar60 & 0x1f)) >> 0x10;
                          do {
                            bVar18 = ""[uVar59];
                            if (psVar56[bVar18] != 0) {
                              iVar55 = psVar28->code_bits;
                              if (iVar55 < 1) {
                                stbi__grow_buffer_unsafe(psVar28);
                                iVar55 = psVar28->code_bits;
                              }
                              sVar22 = psVar28->code_buffer;
                              psVar28->code_buffer = sVar22 * 2;
                              psVar28->code_bits = iVar55 + -1;
                              if (((int)sVar22 < 0) &&
                                 (sVar50 = psVar56[bVar18], (uVar60 & (int)sVar50) == 0)) {
                                uVar49 = -uVar60;
                                if (0 < sVar50) {
                                  uVar49 = uVar60;
                                }
                                psVar56[bVar18] = (short)uVar49 + sVar50;
                              }
                            }
                            bVar64 = (long)uVar59 < (long)psVar28->spec_end;
                            uVar59 = uVar59 + 1;
                          } while (bVar64);
                        }
                      }
                    }
                    iVar55 = psVar28->todo;
                    psVar28->todo = iVar55 + -1;
                    if (iVar55 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar18 = psVar28->marker;
                      if ((bVar18 & 0xf8) != 0xd0) goto LAB_004908ea;
                      psVar28->code_buffer = 0;
                      psVar28->code_bits = 0;
                      psVar28->nomore = 0;
                      psVar28->img_comp[3].dc_pred = 0;
                      psVar28->img_comp[2].dc_pred = 0;
                      psVar28->img_comp[1].dc_pred = 0;
                      psVar28->img_comp[0].dc_pred = 0;
                      psVar28->marker = 0xff;
                      iVar55 = psVar28->restart_interval;
                      if (iVar55 == 0) {
                        iVar55 = 0x7fffffff;
                      }
                      psVar28->todo = iVar55;
                      psVar28->eob_run = 0;
                    }
                    iVar25 = iVar25 + 1;
                  } while (iVar25 != iVar21);
                }
                local_89dc = local_89dc + 1;
              } while (local_89dc != (int)local_8968);
            }
          }
          else {
            iVar21 = psVar28->img_mcu_y;
            if (0 < iVar21) {
              iVar55 = psVar28->img_mcu_x;
              iVar23 = 0;
              do {
                if (0 < iVar55) {
                  iVar21 = 0;
                  do {
                    iVar55 = psVar28->scan_n;
                    if (0 < iVar55) {
                      lVar37 = 0;
                      do {
                        iVar25 = psVar28->order[lVar37];
                        iVar47 = psVar28->img_comp[iVar25].v;
                        if (0 < iVar47) {
                          iVar48 = 0;
                          iVar55 = paVar2[iVar25].h;
                          do {
                            if (0 < iVar55) {
                              iVar47 = 0;
                              do {
                                iVar55 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar28,paVar2[iVar25].coeff +
                                                            (iVar55 * iVar21 + iVar47 +
                                                            (paVar2[iVar25].v * iVar23 + iVar48) *
                                                            paVar2[iVar25].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    ((long)paVar2[iVar25].hd * 0x690 +
                                                    local_8938._0_8_),iVar25);
                                uVar57 = extraout_RDX_08;
                                if (iVar55 == 0) goto LAB_0049101d;
                                iVar55 = paVar2[iVar25].h;
                                iVar47 = iVar47 + 1;
                              } while (iVar47 < iVar55);
                              iVar47 = paVar2[iVar25].v;
                            }
                            iVar48 = iVar48 + 1;
                          } while (iVar48 < iVar47);
                          iVar55 = psVar28->scan_n;
                        }
                        lVar37 = lVar37 + 1;
                      } while (lVar37 < iVar55);
                      iVar25 = psVar28->todo;
                    }
                    psVar28->todo = iVar25 + -1;
                    bVar64 = iVar25 < 2;
                    iVar25 = iVar25 + -1;
                    if (bVar64) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar18 = psVar28->marker;
                      if ((bVar18 & 0xf8) != 0xd0) goto LAB_004908ea;
                      psVar28->code_buffer = 0;
                      psVar28->code_bits = 0;
                      psVar28->nomore = 0;
                      psVar28->img_comp[3].dc_pred = 0;
                      psVar28->img_comp[2].dc_pred = 0;
                      psVar28->img_comp[1].dc_pred = 0;
                      psVar28->img_comp[0].dc_pred = 0;
                      psVar28->marker = 0xff;
                      iVar25 = psVar28->restart_interval;
                      if (iVar25 == 0) {
                        iVar25 = 0x7fffffff;
                      }
                      psVar28->todo = iVar25;
                      psVar28->eob_run = 0;
                    }
                    iVar55 = psVar28->img_mcu_x;
                    iVar21 = iVar21 + 1;
                  } while (iVar21 < iVar55);
                  iVar21 = psVar28->img_mcu_y;
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 < iVar21);
            }
          }
          goto LAB_004908e2;
        }
        uVar60 = (uint)bVar18;
        if (uVar60 == 0xdc) {
          iVar21 = stbi__get16be(psVar28->s);
          sVar22 = stbi__get16be(psVar28->s);
          uVar57 = extraout_RDX_01;
          if (iVar21 == 4) {
            if (sVar22 == psVar28->s->img_y) goto LAB_0048f716;
            pcVar29 = "bad DNL height";
          }
          else {
            pcVar29 = "bad DNL len";
          }
          goto LAB_00491014;
        }
        if (uVar60 == 0xd9) {
          psVar30 = psVar28->s;
          uVar60 = psVar30->img_n;
          if (psVar28->progressive == 0) goto LAB_00490f92;
          if ((int)uVar60 < 1) {
            iVar21 = req_comp + (uint)(req_comp == 0);
            goto LAB_00491114;
          }
          lVar37 = 0;
          do {
            iVar21 = psVar28->img_comp[lVar37].y + 7 >> 3;
            local_8938._0_4_ = iVar21;
            if (0 < iVar21) {
              local_88e8._0_8_ = lVar37;
              iVar21 = 0;
              uVar60 = paVar2[lVar37].x + 7 >> 3;
              do {
                if (0 < (int)uVar60) {
                  uVar57 = 0;
                  do {
                    lVar36 = 0;
                    iVar25 = paVar2[lVar37].tq;
                    psVar56 = paVar2[lVar37].coeff +
                              (paVar2[lVar37].coeff_w * iVar21 + (int)uVar57) * 0x40;
                    do {
                      psVar56[lVar36] = psVar56[lVar36] * psVar28->dequant[iVar25][lVar36];
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != 0x40);
                    (*psVar28->idct_block_kernel)
                              (paVar2[lVar37].data +
                               uVar57 * 8 + (long)(iVar21 * 8 * paVar2[lVar37].w2),paVar2[lVar37].w2
                               ,psVar56);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar60);
                }
                iVar21 = iVar21 + 1;
              } while (iVar21 != local_8938._0_4_);
              psVar30 = psVar28->s;
              lVar37 = local_88e8._0_8_;
            }
            uVar60 = psVar30->img_n;
            lVar37 = lVar37 + 1;
          } while (lVar37 < (int)uVar60);
LAB_00490f92:
          iVar21 = (2 < (int)uVar60) + 1 + (uint)(2 < (int)uVar60);
          if (req_comp != 0) {
            iVar21 = req_comp;
          }
          if (uVar60 == 3) {
            bVar64 = true;
            uVar49 = 3;
            if (psVar28->rgb != 3) {
              uVar60 = 3;
              if (psVar28->app14_color_transform != 0) goto LAB_00491114;
              bVar64 = psVar28->jfif == 0;
            }
          }
          else {
LAB_00491114:
            uVar49 = uVar60;
            bVar64 = false;
          }
          local_88e8._0_4_ = iVar21;
          uVar60 = 1;
          if (bVar64) {
            uVar60 = uVar49;
          }
          local_8998 = (undefined1  [8])0x0;
          uStack_8990 = (stbi_uc *)0x0;
          uStack_8988 = (stbi_uc *)0x0;
          uStack_8980 = 0;
          if (uVar49 != 3) {
            uVar60 = uVar49;
          }
          uVar41 = psVar30->img_x;
          local_8938._4_4_ = 0;
          local_8938._0_4_ = uVar41;
          if (2 < iVar21) {
            uVar60 = uVar49;
          }
          if ((int)uVar60 < 1) {
LAB_00491282:
            sVar22 = psVar30->img_y;
            psVar34 = (stbi__context *)stbi__malloc_mad3(local_88e8._0_4_,local_8938._0_4_,sVar22,1)
            ;
            if (psVar34 != (stbi__context *)0x0) {
              data_00 = psVar34;
              iVar21 = why_00;
              if (sVar22 != 0) {
                uVar57 = (ulong)(uint)local_88e8._0_4_;
                iVar25 = 0;
                uVar49 = 0;
                psVar31 = (stbi_uc *)((long)&psVar34->img_x + 2);
                local_8938._0_8_ = psVar34;
                psVar42 = psVar31;
                do {
                  sVar22 = psVar30->img_x;
                  if (0 < (int)uVar60) {
                    pasVar62 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar59 = 0;
                    piVar58 = &psVar28->img_comp[0].y;
                    do {
                      asVar7 = pasVar62[-3];
                      asVar8 = pasVar62[-1];
                      iVar21 = (int)asVar7 >> 1;
                      auVar85 = (**(code **)(pasVar62 + -10))
                                          (*(stbi_uc **)(piVar58 + 10),
                                           *(undefined8 *)
                                            (*pasVar62 +
                                            ((ulong)(iVar21 <= (int)asVar8) << 3 |
                                            0xffffffffffffffe0)),
                                           *(undefined8 *)
                                            (*pasVar62 +
                                            ((ulong)((int)asVar8 < iVar21) << 3 | 0xffffffffffffffe0
                                            )),pasVar62[-2],pasVar62[-4]);
                      psVar42 = auVar85._8_8_;
                      *(long *)(local_8998 + uVar59 * 8) = auVar85._0_8_;
                      pasVar62[-1] = (stbi_uc  [4])((int)asVar8 + 1);
                      if ((int)asVar7 <= (int)asVar8 + 1) {
                        pasVar62[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar62 + -8) = *(stbi_uc **)(pasVar62 + -6);
                        asVar7 = *pasVar62;
                        *pasVar62 = (stbi_uc  [4])((int)asVar7 + 1);
                        if ((int)asVar7 + 1 < *piVar58) {
                          *(stbi_uc **)(pasVar62 + -6) = *(stbi_uc **)(pasVar62 + -6) + piVar58[1];
                        }
                      }
                      uVar59 = uVar59 + 1;
                      piVar58 = piVar58 + 0x18;
                      pasVar62 = pasVar62 + 0xc;
                    } while (uVar60 != uVar59);
                  }
                  iVar55 = local_88e8._0_4_;
                  data_00 = (stbi__context *)local_8938._0_8_;
                  if ((int)local_88e8._0_4_ < 3) {
                    psVar30 = psVar28->s;
                    if (bVar64) {
                      if (local_88e8._0_4_ == 1) {
                        if (psVar30->img_x != 0) {
                          uVar59 = 0;
                          do {
                            bVar18 = uStack_8988[uVar59];
                            ((stbi_uc *)(local_8938._0_8_ + 0x38))[uVar59 + sVar22 * iVar25 + -0x38]
                                 = (stbi_uc)((uint)bVar18 * 2 +
                                             ((uint)bVar18 + (uint)bVar18 * 8) * 3 +
                                             (uint)uStack_8990[uVar59] * 0x96 +
                                             (uint)*(byte *)((long)local_8998 + uVar59) * 0x4d >> 8)
                            ;
                            uVar59 = uVar59 + 1;
                            psVar42 = uStack_8988;
                          } while (uVar59 < psVar30->img_x);
                        }
                      }
                      else if (psVar30->img_x != 0) {
                        uVar59 = 0;
                        do {
                          bVar18 = uStack_8988[uVar59];
                          ((stbi_uc *)(local_8938._0_8_ + 0x38))
                          [uVar59 * 2 + (ulong)(sVar22 * iVar25) + -0x38] =
                               (stbi_uc)((uint)bVar18 * 2 + ((uint)bVar18 + (uint)bVar18 * 8) * 3 +
                                         (uint)uStack_8990[uVar59] * 0x96 +
                                         (uint)*(byte *)((long)local_8998 + uVar59) * 0x4d >> 8);
                          ((stbi_uc *)(local_8938._0_8_ + 0x38))
                          [uVar59 * 2 + (ulong)(sVar22 * iVar25) + -0x37] = 0xff;
                          uVar59 = uVar59 + 1;
                          psVar42 = uStack_8988;
                        } while (uVar59 < psVar30->img_x);
                      }
                    }
                    else if (psVar30->img_n == 4) {
                      if (psVar28->app14_color_transform == 2) {
                        if (psVar30->img_x != 0) {
                          psVar44 = psVar34->buffer_start + ((ulong)(sVar22 * iVar25) - 0x37);
                          psVar42 = (stbi_uc *)0x0;
                          do {
                            pbVar45 = (byte *)((long)local_8998 + (long)psVar42);
                            pbVar38 = psVar42 + uStack_8980;
                            psVar42 = psVar42 + 1;
                            iVar21 = (*pbVar45 ^ 0xff) * (uint)*pbVar38;
                            psVar44[-1] = (char)((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8);
                            *psVar44 = 0xff;
                            psVar44 = psVar44 + uVar57;
                          } while (psVar42 < (stbi_uc *)(ulong)psVar30->img_x);
                        }
                      }
                      else {
                        if (psVar28->app14_color_transform != 0) goto LAB_004916ec;
                        if (psVar30->img_x != 0) {
                          psVar44 = psVar34->buffer_start + ((ulong)(sVar22 * iVar25) - 0x37);
                          uVar59 = 0;
                          do {
                            bVar18 = *(byte *)(uStack_8980 + uVar59);
                            iVar21 = (uint)*(byte *)((long)local_8998 + uVar59) * (uint)bVar18;
                            iVar55 = (uint)uStack_8990[uVar59] * (uint)bVar18;
                            pbVar45 = uStack_8988 + uVar59;
                            uVar59 = uVar59 + 1;
                            psVar44[-1] = (char)((((uint)*pbVar45 * (uint)bVar18 + 0x80 >> 8) + 0x80
                                                  + (uint)*pbVar45 * (uint)bVar18 >> 8) * 0x1d +
                                                 ((iVar55 + 0x80U >> 8) + 0x80 + iVar55 >> 8) * 0x96
                                                 + ((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8) *
                                                   0x4d >> 8);
                            *psVar44 = 0xff;
                            psVar44 = psVar44 + uVar57;
                            psVar42 = uStack_8990;
                          } while (uVar59 < psVar30->img_x);
                          goto LAB_00491946;
                        }
                      }
                    }
                    else {
LAB_004916ec:
                      if (local_88e8._0_4_ == 1) {
                        if (psVar30->img_x != 0) {
                          psVar44 = (stbi_uc *)0x0;
                          do {
                            ((stbi_uc *)(local_8938._0_8_ + 0x38) +
                            ((ulong)(sVar22 * iVar25) - 0x38))[(long)psVar44] =
                                 *(stbi_uc *)((long)local_8998 + (long)psVar44);
                            psVar44 = psVar44 + 1;
                            psVar42 = (stbi_uc *)(ulong)psVar30->img_x;
                          } while (psVar44 < (stbi_uc *)(ulong)psVar30->img_x);
                        }
                      }
                      else if (psVar30->img_x != 0) {
                        psVar44 = (stbi_uc *)0x0;
                        do {
                          ((stbi_uc *)(local_8938._0_8_ + 0x38))
                          [(long)psVar44 * 2 + (ulong)(sVar22 * iVar25) + -0x38] =
                               *(stbi_uc *)((long)local_8998 + (long)psVar44);
                          ((stbi_uc *)(local_8938._0_8_ + 0x38))
                          [(long)psVar44 * 2 + (ulong)(sVar22 * iVar25) + -0x37] = 0xff;
                          psVar44 = psVar44 + 1;
                          psVar42 = (stbi_uc *)(ulong)psVar30->img_x;
                        } while (psVar44 < (stbi_uc *)(ulong)psVar30->img_x);
                      }
                    }
                  }
                  else {
                    psVar30 = psVar28->s;
                    psVar44 = (stbi_uc *)(local_8938._0_8_ + 0x38) +
                              ((ulong)(uVar49 * local_88e8._0_4_ * sVar22) - 0x38);
                    if (psVar30->img_n == 3) {
                      if (bVar64) {
                        if (psVar30->img_x != 0) {
                          psVar42 = (stbi_uc *)0x0;
                          psVar44 = psVar34->buffer_start + ((ulong)(sVar22 * iVar25) - 0x35);
                          do {
                            psVar44[-3] = *(stbi_uc *)((long)local_8998 + (long)psVar42);
                            psVar44[-2] = uStack_8990[(long)psVar42];
                            psVar1 = uStack_8988 + (long)psVar42;
                            psVar42 = psVar42 + 1;
                            psVar44[-1] = *psVar1;
                            *psVar44 = 0xff;
                            psVar44 = psVar44 + uVar57;
                          } while (psVar42 < (stbi_uc *)(ulong)psVar30->img_x);
                        }
                      }
                      else {
LAB_00491769:
                        (*psVar28->YCbCr_to_RGB_kernel)
                                  (psVar44,(stbi_uc *)local_8998,uStack_8990,uStack_8988,
                                   psVar30->img_x,local_88e8._0_4_);
                        psVar30 = psVar28->s;
                        psVar42 = extraout_RDX_11;
                      }
                    }
                    else if (psVar30->img_n == 4) {
                      if (psVar28->app14_color_transform == 2) {
                        (*psVar28->YCbCr_to_RGB_kernel)
                                  (psVar44,(stbi_uc *)local_8998,uStack_8990,uStack_8988,
                                   psVar30->img_x,local_88e8._0_4_);
                        psVar30 = psVar28->s;
                        psVar42 = extraout_RDX_12;
                        if (psVar30->img_x != 0) {
                          uVar59 = 0;
                          pbVar45 = psVar31 + sVar22 * iVar25;
                          do {
                            bVar18 = *(byte *)(uStack_8980 + uVar59);
                            uVar59 = uVar59 + 1;
                            iVar21 = (pbVar45[-2] ^ 0xff) * (uint)bVar18;
                            pbVar45[-2] = (byte)((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8);
                            iVar21 = (pbVar45[-1] ^ 0xff) * (uint)bVar18;
                            pbVar45[-1] = (byte)((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8);
                            iVar21 = (*pbVar45 ^ 0xff) * (uint)bVar18;
                            uVar41 = iVar21 + 0x80U >> 8;
                            *pbVar45 = (byte)(uVar41 + 0x80 + iVar21 >> 8);
                            pbVar45 = pbVar45 + uVar57;
                            psVar42 = (stbi_uc *)(ulong)uVar41;
                          } while (uVar59 < psVar30->img_x);
                        }
                      }
                      else {
                        if (psVar28->app14_color_transform != 0) goto LAB_00491769;
                        if (psVar30->img_x == 0) goto LAB_0049194e;
                        uVar59 = 0;
                        psVar44 = psVar34->buffer_start + ((ulong)(sVar22 * iVar25) - 0x35);
                        do {
                          bVar18 = *(byte *)(uStack_8980 + uVar59);
                          iVar21 = (uint)*(byte *)((long)local_8998 + uVar59) * (uint)bVar18;
                          psVar44[-3] = (char)((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8);
                          iVar21 = (uint)uStack_8990[uVar59] * (uint)bVar18;
                          psVar44[-2] = (char)((iVar21 + 0x80U >> 8) + 0x80 + iVar21 >> 8);
                          pbVar45 = uStack_8988 + uVar59;
                          uVar59 = uVar59 + 1;
                          psVar44[-1] = (char)(((uint)*pbVar45 * (uint)bVar18 + 0x80 >> 8) + 0x80 +
                                               (uint)*pbVar45 * (uint)bVar18 >> 8);
                          *psVar44 = 0xff;
                          psVar44 = psVar44 + uVar57;
                          psVar42 = uStack_8988;
                        } while (uVar59 < psVar30->img_x);
                      }
LAB_00491946:
                      iVar55 = local_88e8._0_4_;
                    }
                    else if (psVar30->img_x != 0) {
                      auVar85[8] = 0xff;
                      auVar85._0_8_ = 0xffffffffffffffff;
                      auVar85[9] = 0xff;
                      auVar85[10] = 0xff;
                      auVar85[0xb] = 0xff;
                      auVar85[0xc] = 0xff;
                      auVar85[0xd] = 0xff;
                      auVar85[0xe] = 0xff;
                      auVar85[0xf] = 0xff;
                      uVar59 = 0;
                      do {
                        auVar78 = vpinsrb_avx(auVar85,(uint)*(byte *)((long)local_8998 + uVar59),0);
                        uVar59 = uVar59 + 1;
                        auVar78 = vpshufb_avx(auVar78,SUB6416(ZEXT464(0x1000000),0));
                        *(int *)psVar44 = auVar78._0_4_;
                        psVar44 = psVar44 + uVar57;
                      } while (uVar59 < psVar30->img_x);
                    }
                  }
LAB_0049194e:
                  iVar21 = (int)psVar42;
                  uVar49 = uVar49 + 1;
                  iVar25 = iVar25 + iVar55;
                } while (uVar49 < psVar30->img_y);
                uVar49 = psVar30->img_n;
              }
              stbi__free_jpeg_components(psVar28,uVar49,iVar21);
              psVar30 = psVar28->s;
              *local_8950 = psVar30->img_x;
              *local_8948 = psVar30->img_y;
              if (local_8940 != (int *)0x0) {
                *local_8940 = (uint)(2 < psVar30->img_n) * 2 + 1;
              }
              goto LAB_00491032;
            }
            stbi__free_jpeg_components(psVar28,uVar49,why_00);
            pcVar29 = "outofmem";
          }
          else {
            lVar37 = 0;
            while( true ) {
              pvVar32 = malloc((ulong)(uVar41 + 3));
              *(void **)((long)&psVar28->img_comp[0].linebuf + lVar37 * 2) = pvVar32;
              if (pvVar32 == (void *)0x0) break;
              uVar57 = (long)psVar28->img_h_max /
                       (long)*(int *)((long)&psVar28->img_comp[0].h + lVar37 * 2);
              iVar21 = (int)uVar57;
              *(int *)((long)(local_88a8.pal + -7) + lVar37) = iVar21;
              iVar25 = psVar28->img_v_max / *(int *)((long)&psVar28->img_comp[0].v + lVar37 * 2);
              *(int *)((long)(local_88a8.pal + -6) + lVar37) = iVar25;
              *(int *)((long)(local_88a8.pal + -4) + lVar37) = iVar25 >> 1;
              uVar9 = *(undefined8 *)((long)&psVar28->img_comp[0].data + lVar37 * 2);
              *(int *)((long)(local_88a8.pal + -5) + lVar37) =
                   (int)((ulong)((uVar41 - 1) + iVar21) / (uVar57 & 0xffffffff));
              *(undefined4 *)((long)(local_88a8.pal + -3) + lVar37) = 0;
              *(undefined8 *)((long)(local_88a8.pal + -9) + lVar37) = uVar9;
              *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar37) = uVar9;
              if (iVar21 == 2) {
                pcVar33 = stbi__resample_row_h_2;
                if (iVar25 != 1) {
                  if (iVar25 != 2) goto LAB_00491264;
                  pcVar33 = psVar28->resample_row_hv_2_kernel;
                }
              }
              else if (iVar21 == 1) {
                pcVar33 = stbi__resample_row_generic;
                if (iVar25 == 2) {
                  pcVar33 = stbi__resample_row_v_2;
                }
                if (iVar25 == 1) {
                  pcVar33 = resample_row_1;
                }
              }
              else {
LAB_00491264:
                pcVar33 = stbi__resample_row_generic;
              }
              *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar37) = pcVar33;
              lVar37 = lVar37 + 0x30;
              if ((ulong)uVar60 * 0x30 == lVar37) goto LAB_00491282;
            }
            stbi__free_jpeg_components(psVar28,uVar49,why);
            pcVar29 = "outofmem";
          }
          goto LAB_0048f3e1;
        }
        iVar21 = stbi__process_marker(psVar28,uVar60);
        uVar57 = extraout_RDX_00;
        if (iVar21 != 0) goto LAB_0048f716;
      }
LAB_0049101d:
      stbi__free_jpeg_components(psVar28,psVar28->s->img_n,(int)uVar57);
      data_00 = (stbi__context *)0x0;
    }
    else {
      pcVar29 = "bad req_comp";
LAB_0048f3e1:
      data_00 = (stbi__context *)0x0;
      *(char **)(in_FS_OFFSET + -0xb0) = pcVar29;
    }
    goto LAB_00491032;
  }
  if (psVar42 < psVar44) {
LAB_0048f411:
    psVar44 = psVar42 + 1;
    s->img_buffer = psVar44;
    if (*psVar42 != 'B') goto LAB_0048f5a5;
    if (s->img_buffer_end <= psVar44) {
      if (s->read_from_callbacks == 0) goto LAB_0048f5a5;
      stbi__refill_buffer(s);
      psVar44 = s->img_buffer;
    }
    s->img_buffer = psVar44 + 1;
    if (*psVar44 != 'M') goto LAB_0048f5a5;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar60 = stbi__get16le(s);
    iVar21 = stbi__get16le(s);
    uVar60 = iVar21 << 0x10 | uVar60;
    if (((0x38 < uVar60) || ((0x100010000001000U >> ((ulong)uVar60 & 0x3f) & 1) == 0)) &&
       (uVar60 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar60 == 0x7c) goto LAB_0048f4d5;
      goto LAB_0048f5b7;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0048f4d5:
    uStack_8980._4_4_ = 0xff;
    pvVar32 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8998);
    uVar49 = uStack_8980._4_4_;
    uVar60 = (uint)uStack_8980;
    if (pvVar32 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar41 = s->img_y;
    uVar40 = -uVar41;
    if (0 < (int)uVar41) {
      uVar40 = uVar41;
    }
    s->img_y = uVar40;
    if ((uVar40 < 0x1000001) && (uVar53 = s->img_x, uVar53 < 0x1000001)) {
      if ((int)uStack_8990 == 0xc) {
        if (0x17 < (int)local_8998._0_4_) goto LAB_00490d35;
        uVar26 = ((local_8998._4_4_ + -0x18) - local_8978) / 3;
LAB_00490d0d:
        local_89f8 = (ulong)uVar26;
        if (uVar26 == 0) goto LAB_00490d35;
        bVar10 = false;
LAB_00490dce:
        bVar64 = (uint)uStack_8980 == 0xff000000;
        local_88e8._0_4_ = local_8998._0_4_;
        iVar21 = 4 - (uint)((uint)uStack_8980 == 0);
      }
      else {
        if ((int)local_8998._0_4_ < 0x10) {
          uVar26 = local_8998._4_4_ - (local_8978 + (int)uStack_8990) >> 2;
          goto LAB_00490d0d;
        }
LAB_00490d35:
        if (local_8998._4_4_ !=
            ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
          pbrt::LogFatal<char_const(&)[89]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                     ,0x1515,"Check failed: %s",
                     (char (*) [89])
                     "info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                    );
        }
        if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
            (stbi_uc *)(long)(int)local_8998._4_4_) {
          pcVar29 = "bad offset";
          goto LAB_00491c20;
        }
        bVar64 = true;
        bVar10 = true;
        local_89f8 = 0;
        if (local_8998._0_4_ != 0x18 || (uint)uStack_8980 != 0xff000000) goto LAB_00490dce;
        iVar21 = 3;
        local_88e8._0_4_ = 0x18;
        bVar10 = true;
      }
      local_8938._0_4_ = (int)uStack_8990;
      s->img_n = iVar21;
      if (2 < req_comp) {
        iVar21 = req_comp;
      }
      iVar25 = stbi__mad3sizes_valid(iVar21,uVar53,uVar40,0);
      if (iVar25 == 0) goto LAB_00491c19;
      local_88ec = uVar41;
      data_02 = (uchar *)stbi__malloc_mad3(iVar21,uVar53,uVar40,0);
      if (data_02 != (uchar *)0x0) {
        uVar16 = local_8938._0_4_;
        if ((int)local_88e8._0_4_ < 0x10) {
          iVar25 = (int)local_89f8;
          if (!bVar10 && iVar25 < 0x101) {
            if (0 < iVar25) {
              psVar42 = s->img_buffer;
              uVar57 = 0;
              psVar31 = psVar42;
              do {
                psVar44 = s->img_buffer_end;
                if (psVar42 < psVar44) {
LAB_00491a47:
                  psVar31 = psVar42 + 1;
                  s->img_buffer = psVar31;
                  sVar17 = *psVar42;
                  psVar42 = psVar31;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar42 = s->img_buffer;
                    psVar44 = s->img_buffer_end;
                    goto LAB_00491a47;
                  }
                  sVar17 = '\0';
                }
                local_88a8.pal[uVar57 - 0xd][2] = sVar17;
                if (psVar42 < psVar44) {
LAB_00491a8a:
                  psVar31 = psVar42 + 1;
                  s->img_buffer = psVar31;
                  sVar17 = *psVar42;
                  psVar42 = psVar31;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar42 = s->img_buffer;
                    psVar44 = s->img_buffer_end;
                    goto LAB_00491a8a;
                  }
                  sVar17 = '\0';
                }
                local_88a8.pal[uVar57 - 0xd][1] = sVar17;
                if (psVar42 < psVar44) {
LAB_00491ac5:
                  psVar31 = psVar42 + 1;
                  s->img_buffer = psVar31;
                  sVar17 = *psVar42;
                  psVar42 = psVar31;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar42 = s->img_buffer;
                    goto LAB_00491ac5;
                  }
                  sVar17 = '\0';
                }
                local_88a8.pal[uVar57 - 0xd][0] = sVar17;
                if (uVar16 != 0xc) {
                  if (s->img_buffer_end <= psVar31) {
                    psVar42 = psVar31;
                    if (s->read_from_callbacks == 0) goto LAB_00491b16;
                    stbi__refill_buffer(s);
                    psVar31 = s->img_buffer;
                  }
                  psVar42 = psVar31 + 1;
                  s->img_buffer = psVar42;
                  psVar31 = psVar42;
                }
LAB_00491b16:
                local_88a8.pal[uVar57 - 0xd][3] = 0xff;
                uVar57 = uVar57 + 1;
              } while (local_89f8 != uVar57);
            }
            stbi__skip(s,(iVar25 * (uVar16 == 0xc | 0xfffffffc) + local_8998._4_4_) -
                         (uVar16 + local_8978));
            if (local_88e8._0_4_ == 1) {
              sVar22 = s->img_y;
              if (0 < (int)sVar22) {
                iVar55 = 0;
                iVar25 = 0;
                local_8938._0_4_ = -(s->img_x + 7 >> 3) & 3;
                do {
                  pbVar45 = s->img_buffer;
                  if (pbVar45 < s->img_buffer_end) {
LAB_004922f5:
                    s->img_buffer = pbVar45 + 1;
                    uVar60 = (uint)*pbVar45;
                    pbVar45 = pbVar45 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar45 = s->img_buffer;
                      goto LAB_004922f5;
                    }
                    uVar60 = 0;
                  }
                  sVar22 = s->img_x;
                  if (0 < (int)sVar22) {
                    uVar41 = 7;
                    sVar43 = 0;
                    do {
                      uVar57 = (ulong)(uVar60 >> (uVar41 & 0x1f) & 1);
                      data_02[iVar55] = local_88a8.pal[uVar57 - 0xd][0];
                      sVar17 = local_88a8.pal[uVar57 - 0xd][2];
                      data_02[(long)iVar55 + 1] = local_88a8.pal[uVar57 - 0xd][1];
                      data_02[(long)iVar55 + 2] = sVar17;
                      iVar23 = iVar55 + 3;
                      if (iVar21 == 4) {
                        data_02[(long)iVar55 + 3] = 0xff;
                        iVar23 = iVar55 + 4;
                      }
                      iVar55 = iVar23;
                      sVar43 = sVar43 + 1;
                      if (sVar43 == sVar22) break;
                      if ((int)uVar41 < 1) {
                        if (s->img_buffer_end <= pbVar45) {
                          if (s->read_from_callbacks == 0) {
                            uVar60 = 0;
                            uVar41 = 7;
                            goto LAB_004923bc;
                          }
                          stbi__refill_buffer(s);
                          pbVar45 = s->img_buffer;
                          sVar22 = s->img_x;
                        }
                        uVar41 = 7;
                        s->img_buffer = pbVar45 + 1;
                        uVar60 = (uint)*pbVar45;
                        pbVar45 = pbVar45 + 1;
                      }
                      else {
                        uVar41 = uVar41 - 1;
                      }
LAB_004923bc:
                    } while ((int)sVar43 < (int)sVar22);
                  }
                  stbi__skip(s,local_8938._0_4_);
                  sVar22 = s->img_y;
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)sVar22);
              }
            }
            else {
              if (local_88e8._0_4_ == 8) {
                uVar60 = s->img_x;
              }
              else {
                if (local_88e8._0_4_ != 4) {
                  free(data_02);
                  pcVar29 = "bad bpp";
                  goto LAB_00491c20;
                }
                uVar60 = s->img_x + 1 >> 1;
              }
              sVar22 = s->img_y;
              if (0 < (int)sVar22) {
                uVar57 = 0;
                iVar25 = 0;
                local_8938._0_4_ = -uVar60 & 3;
                do {
                  if (0 < (int)s->img_x) {
                    pbVar45 = s->img_buffer;
                    iVar23 = 0;
                    iVar55 = local_88e8._0_4_;
                    do {
                      if (pbVar45 < s->img_buffer_end) {
LAB_0049213d:
                        s->img_buffer = pbVar45 + 1;
                        uVar60 = (uint)*pbVar45;
                        pbVar45 = pbVar45 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar45 = s->img_buffer;
                          iVar55 = local_88e8._0_4_;
                          goto LAB_0049213d;
                        }
                        uVar60 = 0;
                      }
                      uVar40 = uVar60 & 0xf;
                      uVar41 = uVar60 >> 4;
                      if (iVar55 != 4) {
                        uVar41 = uVar60;
                      }
                      uVar59 = (ulong)uVar41;
                      sVar17 = local_88a8.pal[uVar59 - 0xd][1];
                      sVar3 = local_88a8.pal[uVar59 - 0xd][2];
                      if (iVar55 != 4) {
                        uVar40 = 0;
                      }
                      lVar37 = (long)(int)uVar57;
                      uVar51 = lVar37 + 3;
                      data_02[lVar37] = local_88a8.pal[uVar59 - 0xd][0];
                      data_02[lVar37 + 1] = sVar17;
                      data_02[lVar37 + 2] = sVar3;
                      if (iVar21 == 4) {
                        data_02[lVar37 + 3] = 0xff;
                        uVar51 = (ulong)((int)uVar57 + 4);
                      }
                      if (iVar23 + 1U == s->img_x) {
                        uVar57 = uVar51 & 0xffffffff;
                        break;
                      }
                      if (iVar55 == 8) {
                        if (s->img_buffer_end <= pbVar45) {
                          if (s->read_from_callbacks == 0) {
                            uVar40 = 0;
                            goto LAB_00492203;
                          }
                          stbi__refill_buffer(s);
                          pbVar45 = s->img_buffer;
                          iVar55 = local_88e8._0_4_;
                        }
                        s->img_buffer = pbVar45 + 1;
                        uVar40 = (uint)*pbVar45;
                        pbVar45 = pbVar45 + 1;
                      }
LAB_00492203:
                      uVar59 = (ulong)uVar40;
                      sVar17 = local_88a8.pal[uVar59 - 0xd][1];
                      sVar3 = local_88a8.pal[uVar59 - 0xd][2];
                      lVar37 = (long)(int)uVar51;
                      uVar57 = lVar37 + 3;
                      data_02[lVar37] = local_88a8.pal[uVar59 - 0xd][0];
                      data_02[lVar37 + 1] = sVar17;
                      data_02[lVar37 + 2] = sVar3;
                      if (iVar21 == 4) {
                        data_02[lVar37 + 3] = 0xff;
                        uVar57 = (ulong)((int)uVar51 + 4);
                      }
                      iVar23 = iVar23 + 2;
                    } while (iVar23 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8938._0_4_);
                  sVar22 = s->img_y;
                  iVar25 = iVar25 + 1;
                } while (iVar25 < (int)sVar22);
              }
            }
            goto LAB_00492405;
          }
          free(data_02);
          pcVar29 = "invalid";
          goto LAB_00491c20;
        }
        stbi__skip(s,local_8998._4_4_ - (local_8938._0_4_ + local_8978));
        if (local_88e8._0_4_ != 0x10) {
          if (local_88e8._0_4_ == 0x20) {
            local_89cc = 0;
            if (!(bool)((uStack_8990._4_4_ == 0xff0000 &&
                        ((uint)uStack_8988 == 0xff00 && uStack_8988._4_4_ == 0xff)) & bVar64))
            goto LAB_00491cb7;
            iVar25 = 0;
            iVar55 = 0;
            iVar23 = 0;
            bVar10 = true;
            bVar64 = false;
            uVar41 = 0;
            uVar40 = 0;
            local_8958 = (anon_struct_96_18_0d0905d3 *)((ulong)local_8958._4_4_ << 0x20);
            local_8960 = (ulong)local_8960._4_4_ << 0x20;
            iVar47 = 0;
          }
          else {
            local_89cc = 0;
            if (local_88e8._0_4_ != 0x18) goto LAB_00491cb7;
            iVar25 = 0;
            iVar55 = 0;
            iVar23 = 0;
            local_89cc = s->img_x & 3;
            bVar10 = false;
            bVar64 = false;
            uVar41 = 0;
            uVar40 = 0;
            local_8958 = (anon_struct_96_18_0d0905d3 *)((ulong)local_8958._4_4_ << 0x20);
            iVar47 = 0;
            local_8960 = (ulong)local_8960._4_4_ << 0x20;
          }
LAB_00491dce:
          sVar22 = s->img_y;
          if (0 < (int)sVar22) {
            iVar24 = 0;
            iVar48 = 0;
            local_8938._0_8_ = data_02;
            do {
              local_8968 = CONCAT44(local_8968._4_4_,iVar48);
              if (bVar64) {
                if (0 < (int)s->img_x) {
                  iVar48 = 0;
                  do {
                    uVar53 = stbi__get16le(s);
                    if (local_88e8._0_4_ != 0x10) {
                      iVar27 = stbi__get16le(s);
                      uVar53 = uVar53 | iVar27 << 0x10;
                    }
                    iVar27 = stbi__shiftsigned(uVar53 & uStack_8990._4_4_,iVar47,uVar41);
                    uVar9 = local_8938._0_8_;
                    lVar37 = (long)iVar24;
                    *(char *)(local_8938._0_8_ + lVar37) = (char)iVar27;
                    iVar27 = stbi__shiftsigned(uVar53 & (uint)uStack_8988,iVar25,uVar40);
                    *(char *)(uVar9 + 1 + lVar37) = (char)iVar27;
                    iVar27 = stbi__shiftsigned(uVar53 & uStack_8988._4_4_,iVar55,(int)local_8958);
                    *(char *)(uVar9 + 2 + lVar37) = (char)iVar27;
                    if (uVar60 == 0) {
                      uVar53 = 0xff;
                    }
                    else {
                      uVar53 = stbi__shiftsigned(uVar53 & uVar60,iVar23,(uint)local_8960);
                    }
                    uVar57 = lVar37 + 3;
                    if (iVar21 == 4) {
                      *(char *)(local_8938._0_8_ + uVar57) = (char)uVar53;
                      uVar57 = (ulong)(iVar24 + 4);
                    }
                    uVar49 = uVar49 | uVar53;
                    iVar48 = iVar48 + 1;
                    iVar24 = (int)uVar57;
                  } while (iVar48 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                pbVar45 = s->img_buffer;
                iVar48 = 0;
                do {
                  pbVar38 = s->img_buffer_end;
                  uVar9 = local_8938._0_8_;
                  if (pbVar45 < pbVar38) {
LAB_00491f53:
                    s->img_buffer = pbVar45 + 1;
                    bVar18 = *pbVar45;
                    pbVar45 = pbVar45 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar45 = s->img_buffer;
                      pbVar38 = s->img_buffer_end;
                      goto LAB_00491f53;
                    }
                    bVar18 = 0;
                  }
                  lVar37 = (long)iVar24;
                  *(byte *)(uVar9 + 2 + lVar37) = bVar18;
                  if (pbVar45 < pbVar38) {
LAB_00491f9a:
                    s->img_buffer = pbVar45 + 1;
                    bVar18 = *pbVar45;
                    pbVar45 = pbVar45 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar45 = s->img_buffer;
                      pbVar38 = s->img_buffer_end;
                      goto LAB_00491f9a;
                    }
                    bVar18 = 0;
                  }
                  *(byte *)(uVar9 + 1 + lVar37) = bVar18;
                  if (pbVar45 < pbVar38) {
LAB_00491fd6:
                    s->img_buffer = pbVar45 + 1;
                    bVar18 = *pbVar45;
                    pbVar45 = pbVar45 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar45 = s->img_buffer;
                      goto LAB_00491fd6;
                    }
                    bVar18 = 0;
                  }
                  *(byte *)(uVar9 + lVar37) = bVar18;
                  bVar18 = 0xff;
                  if (bVar10) {
                    if (s->img_buffer_end <= pbVar45) {
                      if (s->read_from_callbacks == 0) {
                        bVar18 = 0;
                        goto LAB_0049202d;
                      }
                      stbi__refill_buffer(s);
                      pbVar45 = s->img_buffer;
                    }
                    s->img_buffer = pbVar45 + 1;
                    bVar18 = *pbVar45;
                    pbVar45 = pbVar45 + 1;
                  }
LAB_0049202d:
                  uVar57 = lVar37 + 3;
                  if (iVar21 == 4) {
                    *(byte *)(uVar9 + uVar57) = bVar18;
                    uVar57 = (ulong)(iVar24 + 4);
                  }
                  iVar48 = iVar48 + 1;
                  iVar24 = (int)uVar57;
                  uVar49 = uVar49 | bVar18;
                } while (iVar48 < (int)s->img_x);
              }
              stbi__skip(s,local_89cc);
              sVar22 = s->img_y;
              iVar48 = (int)local_8968 + 1;
              data_02 = (uchar *)local_8938._0_8_;
            } while (iVar48 < (int)sVar22);
          }
LAB_00492405:
          if (((iVar21 == 4) && (uVar49 == 0)) &&
             (uVar60 = s->img_x * sVar22 * 4 - 1, -1 < (int)uVar60)) {
            auVar65 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
            auVar66 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
            auVar67 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
            auVar68 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
            auVar69 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
            auVar70 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
            auVar71 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar72 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            puVar35 = data_02 + uVar60;
            auVar73 = vpbroadcastq_avx512f();
            uVar57 = 0;
            do {
              auVar74 = vpbroadcastq_avx512f();
              auVar75 = vporq_avx512f(auVar74,auVar72);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                *puVar35 = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-4] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-8] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0xc] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0x10] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0x14] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0x18] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0x1c] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar71);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0x20] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0x24] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0x28] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0x2c] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0x30] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0x34] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0x38] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0x3c] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar70);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0x40] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0x44] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0x48] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0x4c] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0x50] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0x54] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0x58] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0x5c] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar69);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0x60] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-100] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0x68] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0x6c] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0x70] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0x74] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0x78] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0x7c] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar68);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0x80] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0x84] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0x88] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0x8c] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0x90] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0x94] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0x98] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0x9c] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar67);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0xa0] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0xa4] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0xa8] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0xac] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0xb0] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0xb4] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0xb8] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0xbc] = 0xff;
              }
              auVar75 = vporq_avx512f(auVar74,auVar66);
              uVar59 = vpcmpuq_avx512f(auVar75,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0xc0] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0xc4] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-200] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0xcc] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0xd0] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0xd4] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0xd8] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0xdc] = 0xff;
              }
              auVar74 = vporq_avx512f(auVar74,auVar65);
              uVar59 = vpcmpuq_avx512f(auVar74,auVar73,2);
              if ((uVar59 & 1) != 0) {
                puVar35[-0xe0] = 0xff;
              }
              if ((uVar59 & 2) != 0) {
                puVar35[-0xe4] = 0xff;
              }
              if ((uVar59 & 4) != 0) {
                puVar35[-0xe8] = 0xff;
              }
              if ((uVar59 & 8) != 0) {
                puVar35[-0xec] = 0xff;
              }
              if ((uVar59 & 0x10) != 0) {
                puVar35[-0xf0] = 0xff;
              }
              if ((uVar59 & 0x20) != 0) {
                puVar35[-0xf4] = 0xff;
              }
              if ((uVar59 & 0x40) != 0) {
                puVar35[-0xf8] = 0xff;
              }
              if ((uVar59 & 0x80) != 0) {
                puVar35[-0xfc] = 0xff;
              }
              uVar57 = uVar57 + 0x40;
              puVar35 = puVar35 + -0x100;
            } while (((uVar60 >> 2) + 0x40 & 0x3fffffc0) != uVar57);
          }
          if ((int)local_88ec < 1) {
            uVar60 = s->img_x;
          }
          else {
            uVar60 = s->img_x;
            if (0 < (int)sVar22 >> 1) {
              uVar49 = uVar60 * iVar21;
              uVar57 = 0;
              uVar59 = 0;
              uVar41 = (sVar22 - 1) * uVar49;
              do {
                if (0 < (int)uVar49) {
                  uVar51 = 0;
                  do {
                    uVar4 = data_02[uVar51 + uVar57];
                    data_02[uVar51 + uVar57] = data_02[uVar51 + uVar41];
                    data_02[uVar51 + uVar41] = uVar4;
                    uVar51 = uVar51 + 1;
                  } while (uVar49 != uVar51);
                }
                uVar59 = uVar59 + 1;
                uVar41 = uVar41 - uVar49;
                uVar57 = (ulong)((int)uVar57 + uVar49);
              } while (uVar59 != (uint)((int)sVar22 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar21 != req_comp)) {
            data_02 = stbi__convert_format(data_02,iVar21,req_comp,uVar60,sVar22);
            if (data_02 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar60 = s->img_x;
          }
          *local_8950 = uVar60;
          *local_8948 = s->img_y;
          if (local_8940 != (int *)0x0) {
            *local_8940 = s->img_n;
            return data_02;
          }
          return data_02;
        }
        local_89cc = s->img_x * 2 & 2;
LAB_00491cb7:
        if (((uint)uStack_8988 != 0 && uStack_8990._4_4_ != 0) && uStack_8988._4_4_ != 0) {
          iVar47 = stbi__high_bit(uStack_8990._4_4_);
          uVar41 = stbi__bitcount(uStack_8990._4_4_);
          iVar25 = stbi__high_bit((uint)uStack_8988);
          uVar40 = stbi__bitcount((uint)uStack_8988);
          iVar55 = stbi__high_bit(uStack_8988._4_4_);
          uVar53 = stbi__bitcount(uStack_8988._4_4_);
          iVar23 = stbi__high_bit(uVar60);
          uVar26 = stbi__bitcount(uVar60);
          local_8958 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_8958._4_4_,uVar53);
          local_8960 = CONCAT44(local_8960._4_4_,uVar26);
          if ((uVar53 < 9 && (uVar40 < 9 && uVar41 < 9)) && uVar26 < 9) {
            bVar64 = true;
            bVar10 = false;
            iVar47 = iVar47 + -7;
            iVar25 = iVar25 + -7;
            iVar23 = iVar23 + -7;
            iVar55 = iVar55 + -7;
            goto LAB_00491dce;
          }
        }
        free(data_02);
        pcVar29 = "bad masks";
        goto LAB_00491c20;
      }
LAB_00492f8c:
      pcVar29 = "outofmem";
      goto LAB_00491c20;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar42 = s->img_buffer;
      goto LAB_0048f411;
    }
LAB_0048f5a5:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0048f5b7:
    iVar21 = stbi__gif_test(s);
    if (iVar21 != 0) {
      memset(&local_88a8,0,0x8870);
      data_00 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_8940,0,psVar31);
      if (data_00 == (stbi__context *)0x0 || data_00 == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data_00 = (stbi__context *)0x0;
      }
      else {
        *local_8950 = local_88a8.w;
        *local_8948 = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data_00 = (stbi__context *)
                    stbi__convert_format((uchar *)data_00,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      psVar28 = (stbi__jpeg *)local_88a8.background;
LAB_00491032:
      free(psVar28);
      return data_00;
    }
    iVar21 = stbi__get16be(s);
    uVar60 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar60 | iVar21 << 0x10) != 0x38425053) {
      iVar21 = stbi__pnm_test(s);
      if (iVar21 != 0) {
        pvVar32 = stbi__pnm_load(s,(int *)local_8950,(int *)local_8948,local_8940,req_comp,ri_00);
        return pvVar32;
      }
      iVar21 = stbi__hdr_test(s);
      piVar58 = local_8940;
      psVar15 = local_8948;
      psVar14 = local_8950;
      if (iVar21 != 0) {
        data_01 = stbi__hdr_load(s,(int *)local_8950,(int *)local_8948,local_8940,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar58;
        }
        psVar31 = stbi__hdr_to_ldr(data_01,*psVar14,*psVar15,req_comp);
        return psVar31;
      }
      iVar21 = stbi__tga_test(s);
      if (iVar21 != 0) {
        pvVar32 = stbi__tga_load(s,(int *)local_8950,(int *)local_8948,local_8940,req_comp,ri_00);
        return pvVar32;
      }
      pcVar29 = "unknown image type";
      goto LAB_00491c20;
    }
    iVar21 = stbi__get16be(s);
    uVar60 = stbi__get16be(s);
    if ((uVar60 | iVar21 << 0x10) != 0x38425053) {
      pcVar29 = "not PSD";
      goto LAB_00491c20;
    }
    iVar21 = stbi__get16be(s);
    if (iVar21 != 1) {
      pcVar29 = "wrong version";
      goto LAB_00491c20;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar31 = s->img_buffer;
LAB_00490bd3:
      s->img_buffer = psVar31 + 6;
    }
    else {
      psVar31 = s->img_buffer;
      iVar21 = (int)s->img_buffer_end - (int)psVar31;
      if (5 < iVar21) goto LAB_00490bd3;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar21);
    }
    uVar60 = stbi__get16be(s);
    if (0x10 < uVar60) {
      pcVar29 = "wrong channel count";
      goto LAB_00491c20;
    }
    iVar21 = stbi__get16be(s);
    uVar41 = iVar21 * 0x10000;
    iVar21 = stbi__get16be(s);
    uVar49 = uVar41 + iVar21;
    iVar25 = stbi__get16be(s);
    iVar55 = stbi__get16be(s);
    if ((int)uVar49 < 0x1000001) {
      uVar40 = iVar25 * 0x10000;
      uVar57 = (ulong)uVar40;
      uVar53 = uVar40 + iVar55;
      if ((int)uVar53 < 0x1000001) {
        iVar25 = stbi__get16be(s);
        if ((iVar25 != 8) && (iVar25 != 0x10)) {
          pcVar29 = "unsupported bit depth";
          goto LAB_00491c20;
        }
        iVar23 = stbi__get16be(s);
        if (iVar23 != 3) {
          pcVar29 = "wrong color format";
          goto LAB_00491c20;
        }
        sVar22 = stbi__get32be(s);
        stbi__skip(s,sVar22);
        sVar22 = stbi__get32be(s);
        stbi__skip(s,sVar22);
        sVar22 = stbi__get32be(s);
        stbi__skip(s,sVar22);
        uVar26 = stbi__get16be(s);
        if (1 < uVar26) {
          pcVar29 = "bad compression";
          goto LAB_00491c20;
        }
        iVar23 = stbi__mad3sizes_valid(4,uVar53,uVar49,0);
        if (iVar23 != 0) {
          local_8960 = CONCAT44(local_8960._4_4_,uVar60);
          local_8968 = (ulong)uVar41;
          if (((local_8938._0_4_ == 0x10) && (iVar25 == 0x10)) && (uVar26 == 0)) {
            data_03 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar53,uVar49,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_03 = (stbi__uint16 *)malloc((long)(int)(uVar49 * uVar53 * 4));
          }
          if (data_03 != (stbi__uint16 *)0x0) {
            iVar23 = uVar53 * uVar49;
            uVar59 = local_8960 & 0xffffffff;
            if (uVar26 == 0) {
              psVar46 = data_03 + 0x7e;
              psVar63 = data_03 + 0x7c;
              bVar64 = local_8938._0_4_ == 0x10;
              auVar65 = vpbroadcastq_avx512f();
              uVar51 = CONCAT44(0,(iVar21 + (int)local_8968) * (iVar55 + uVar40));
              local_8938._0_8_ = uVar51;
              uVar61 = 0;
              local_8958 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_8958._4_4_,iVar23);
              local_88e8 = vmovdqu64_avx512f(auVar65);
              local_89c8 = data_03;
              local_89b8 = data_03;
              do {
                if (uVar61 < uVar59) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar23) {
                      lVar37 = 0;
                      do {
                        iVar23 = stbi__get16be(s);
                        auVar65 = vmovdqu64_avx512f(local_88e8);
                        local_89b8[lVar37 * 4] = (stbi__uint16)iVar23;
                        lVar37 = lVar37 + 1;
                      } while (local_8938._0_4_ != (int)lVar37);
                    }
                  }
                  else if (iVar25 == 0x10) {
                    if (0 < iVar23) {
                      lVar37 = 0;
                      do {
                        iVar23 = stbi__get16be(s);
                        auVar65 = vmovdqu64_avx512f(local_88e8);
                        *(char *)(local_89c8 + lVar37 * 2) = (char)((uint)iVar23 >> 8);
                        lVar37 = lVar37 + 1;
                      } while (local_8938._0_4_ != (int)lVar37);
                    }
                  }
                  else if (0 < iVar23) {
                    lVar37 = 0;
                    psVar31 = s->img_buffer;
                    do {
                      if (psVar31 < s->img_buffer_end) {
LAB_004937fd:
                        s->img_buffer = psVar31 + 1;
                        sVar17 = *psVar31;
                        psVar31 = psVar31 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar65 = vmovdqu64_avx512f(local_88e8);
                          psVar31 = s->img_buffer;
                          goto LAB_004937fd;
                        }
                        sVar17 = '\0';
                      }
                      *(stbi_uc *)(local_89c8 + lVar37 * 2) = sVar17;
                      lVar37 = lVar37 + 1;
                    } while (local_8938._0_4_ != (int)lVar37);
                  }
                }
                else if (iVar25 == 0x10 && bVar64) {
                  if (0 < iVar23) {
                    uVar39 = 0;
                    sVar20 = -(ushort)(uVar61 == 3);
                    do {
                      auVar66 = vpbroadcastq_avx512f();
                      auVar67 = vporq_avx512f(auVar66,_DAT_00a21740);
                      uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                      if ((uVar11 & 1) != 0) {
                        psVar63[(uVar39 - 0x1f) * 4] = sVar20;
                      }
                      if ((uVar11 & 2) != 0) {
                        psVar63[(uVar39 - 0x1e) * 4] = sVar20;
                      }
                      if ((uVar11 & 4) != 0) {
                        psVar63[(uVar39 - 0x1d) * 4] = sVar20;
                      }
                      if ((uVar11 & 8) != 0) {
                        psVar63[(uVar39 - 0x1c) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x10) != 0) {
                        psVar63[(uVar39 - 0x1b) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x20) != 0) {
                        psVar63[(uVar39 - 0x1a) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x40) != 0) {
                        psVar63[(uVar39 - 0x19) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x80) != 0) {
                        psVar63[(uVar39 - 0x18) * 4] = sVar20;
                      }
                      auVar67 = vporq_avx512f(auVar66,_DAT_00a21700);
                      uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                      if ((uVar11 & 1) != 0) {
                        psVar63[(uVar39 - 0x17) * 4] = sVar20;
                      }
                      if ((uVar11 & 2) != 0) {
                        psVar63[(uVar39 - 0x16) * 4] = sVar20;
                      }
                      if ((uVar11 & 4) != 0) {
                        psVar63[(uVar39 - 0x15) * 4] = sVar20;
                      }
                      if ((uVar11 & 8) != 0) {
                        psVar63[(uVar39 - 0x14) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x10) != 0) {
                        psVar63[(uVar39 - 0x13) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x20) != 0) {
                        psVar63[(uVar39 - 0x12) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x40) != 0) {
                        psVar63[(uVar39 - 0x11) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x80) != 0) {
                        psVar63[(uVar39 - 0x10) * 4] = sVar20;
                      }
                      auVar67 = vporq_avx512f(auVar66,_DAT_00a216c0);
                      uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                      if ((uVar11 & 1) != 0) {
                        psVar63[(uVar39 - 0xf) * 4] = sVar20;
                      }
                      if ((uVar11 & 2) != 0) {
                        psVar63[(uVar39 - 0xe) * 4] = sVar20;
                      }
                      if ((uVar11 & 4) != 0) {
                        psVar63[(uVar39 - 0xd) * 4] = sVar20;
                      }
                      if ((uVar11 & 8) != 0) {
                        psVar63[(uVar39 - 0xc) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x10) != 0) {
                        psVar63[(uVar39 - 0xb) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x20) != 0) {
                        psVar63[(uVar39 - 10) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x40) != 0) {
                        psVar63[(uVar39 - 9) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x80) != 0) {
                        psVar63[(uVar39 - 8) * 4] = sVar20;
                      }
                      auVar66 = vporq_avx512f(auVar66,_DAT_00a21680);
                      uVar11 = vpcmpuq_avx512f(auVar66,auVar65,2);
                      if ((uVar11 & 1) != 0) {
                        psVar63[(uVar39 - 7) * 4] = sVar20;
                      }
                      if ((uVar11 & 2) != 0) {
                        psVar63[(uVar39 - 6) * 4] = sVar20;
                      }
                      if ((uVar11 & 4) != 0) {
                        psVar63[(uVar39 - 5) * 4] = sVar20;
                      }
                      if ((uVar11 & 8) != 0) {
                        psVar63[(uVar39 - 4) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x10) != 0) {
                        psVar63[(uVar39 - 3) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x20) != 0) {
                        psVar63[(uVar39 - 2) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x40) != 0) {
                        psVar63[(uVar39 - 1) * 4] = sVar20;
                      }
                      if ((uVar11 & 0x80) != 0) {
                        psVar63[uVar39 * 4] = sVar20;
                      }
                      uVar39 = uVar39 + 0x20;
                    } while ((uVar51 + 0x1f & 0xffffffffffffffe0) != uVar39);
                  }
                }
                else if (0 < iVar23) {
                  cVar19 = -(uVar61 == 3);
                  uVar39 = 0;
                  do {
                    auVar66 = vpbroadcastq_avx512f();
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a21740);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x7e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x7c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x7a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x78) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x76) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x74) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x72) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x70) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a21700);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x6e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x6c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x6a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x68) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x66) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -100) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x62) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x60) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a216c0);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x5e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x5c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x5a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x58) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x56) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x54) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x52) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x50) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a21680);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x4e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x4c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x4a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x48) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x46) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x44) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x42) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x40) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a21640);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x3e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x3c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x3a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x38) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x36) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x34) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x32) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x30) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a21600);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x2e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x2c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x2a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x28) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x26) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x24) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x22) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x20) = cVar19;
                    }
                    auVar67 = vporq_avx512f(auVar66,_DAT_00a215c0);
                    uVar11 = vpcmpuq_avx512f(auVar67,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x1e) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x1c) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x1a) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x18) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x16) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x14) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x12) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0x10) = cVar19;
                    }
                    auVar66 = vporq_avx512f(auVar66,_DAT_00a21580);
                    uVar11 = vpcmpuq_avx512f(auVar66,auVar65,2);
                    if ((uVar11 & 1) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0xe) = cVar19;
                    }
                    if ((uVar11 & 2) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -0xc) = cVar19;
                    }
                    if ((uVar11 & 4) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -10) = cVar19;
                    }
                    if ((uVar11 & 8) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -8) = cVar19;
                    }
                    if ((uVar11 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -6) = cVar19;
                    }
                    if ((uVar11 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -4) = cVar19;
                    }
                    if ((uVar11 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar39 * 2 + -2) = cVar19;
                    }
                    if ((uVar11 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar39 * 2) = cVar19;
                    }
                    uVar39 = uVar39 + 0x40;
                  } while ((uVar51 + 0x3f & 0xffffffffffffffc0) != uVar39);
                }
                uVar60 = (uint)uVar57;
                local_89c8 = (stbi__uint16 *)((long)local_89c8 + 1);
                local_89b8 = local_89b8 + 1;
                psVar46 = (stbi__uint16 *)((long)psVar46 + 1);
                psVar63 = psVar63 + 1;
                uVar61 = uVar61 + 1;
                iVar23 = (int)local_8958;
              } while (uVar61 != 4);
            }
            else {
              stbi__skip(s,(uint)local_8960 * uVar49 * 2);
              auVar72 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
              auVar71 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
              auVar70 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
              auVar69 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
              auVar68 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
              auVar67 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
              auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar65 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              psVar46 = data_03 + 0x7e;
              uVar51 = 0;
              iVar25 = (int)local_8968;
              auVar73 = vpbroadcastq_avx512f();
              local_8938 = vmovdqu64_avx512f(auVar73);
              do {
                if (uVar51 < uVar59) {
                  iVar47 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_03 + uVar51),iVar23);
                  auVar65 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar67 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
                  auVar68 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
                  auVar69 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
                  auVar70 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
                  auVar71 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
                  auVar72 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
                  auVar73 = vmovdqu64_avx512f(local_8938);
                  if (iVar47 == 0) {
                    free(data_03);
                    pcVar29 = "corrupt";
                    goto LAB_00491c20;
                  }
                }
                else if (0 < iVar23) {
                  uVar61 = 0;
                  cVar19 = -(uVar51 == 3);
                  do {
                    auVar74 = vpbroadcastq_avx512f();
                    auVar75 = vporq_avx512f(auVar74,auVar65);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x7e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x7c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x7a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x78) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x76) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x74) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x72) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x70) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar66);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x6e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x6c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x6a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x68) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x66) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -100) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x62) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x60) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar67);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x5e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x5c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x5a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x58) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x56) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x54) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x52) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x50) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar68);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x4e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x4c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x4a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x48) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x46) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x44) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x42) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x40) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar69);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x3e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x3c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x3a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x38) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x36) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x34) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x32) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x30) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar70);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x2e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x2c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x2a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x28) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x26) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x24) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x22) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x20) = cVar19;
                    }
                    auVar75 = vporq_avx512f(auVar74,auVar71);
                    uVar39 = vpcmpuq_avx512f(auVar75,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x1e) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x1c) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x1a) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x18) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x16) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x14) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x12) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0x10) = cVar19;
                    }
                    auVar74 = vporq_avx512f(auVar74,auVar72);
                    uVar39 = vpcmpuq_avx512f(auVar74,auVar73,2);
                    if ((uVar39 & 1) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0xe) = cVar19;
                    }
                    if ((uVar39 & 2) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -0xc) = cVar19;
                    }
                    if ((uVar39 & 4) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -10) = cVar19;
                    }
                    if ((uVar39 & 8) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -8) = cVar19;
                    }
                    if ((uVar39 & 0x10) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -6) = cVar19;
                    }
                    if ((uVar39 & 0x20) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -4) = cVar19;
                    }
                    if ((uVar39 & 0x40) != 0) {
                      *(char *)(psVar46 + uVar61 * 2 + -2) = cVar19;
                    }
                    if ((uVar39 & 0x80) != 0) {
                      *(char *)(psVar46 + uVar61 * 2) = cVar19;
                    }
                    uVar61 = uVar61 + 0x40;
                  } while (((ulong)((iVar21 + iVar25) * (iVar55 + uVar40)) + 0x3f &
                           0xffffffffffffffc0) != uVar61);
                }
                uVar60 = (uint)uVar57;
                uVar51 = uVar51 + 1;
                psVar46 = (stbi__uint16 *)((long)psVar46 + 1);
              } while (uVar51 != 4);
            }
            if (3 < (uint)local_8960) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar23) {
                  uVar57 = 0;
                  do {
                    uVar6 = data_03[uVar57 * 4 + 3];
                    if ((uVar6 != 0) && (uVar6 != 0xffff)) {
                      auVar85 = vpmovzxwd_avx(ZEXT416(*(uint *)(data_03 + uVar57 * 4)));
                      auVar85 = vcvtdq2ps_avx(auVar85);
                      fVar76 = 1.0 / ((float)uVar6 / 65535.0);
                      auVar83._4_4_ = fVar76;
                      auVar83._0_4_ = fVar76;
                      auVar83._8_4_ = fVar76;
                      auVar83._12_4_ = fVar76;
                      fVar77 = (1.0 - fVar76) * 65535.0;
                      auVar84._4_4_ = fVar77;
                      auVar84._0_4_ = fVar77;
                      auVar84._8_4_ = fVar77;
                      auVar84._12_4_ = fVar77;
                      auVar85 = vfmadd231ps_fma(auVar84,auVar85,auVar83);
                      auVar78._0_4_ = (int)auVar85._0_4_;
                      auVar78._4_4_ = (int)auVar85._4_4_;
                      auVar78._8_4_ = (int)auVar85._8_4_;
                      auVar78._12_4_ = (int)auVar85._12_4_;
                      auVar85 = vpshuflw_avx(auVar78,0xe8);
                      *(int *)(data_03 + uVar57 * 4) = auVar85._0_4_;
                      auVar79._0_4_ = (float)data_03[uVar57 * 4 + 2];
                      auVar79._4_12_ = in_register_000014c4;
                      auVar85 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar76),ZEXT416((uint)fVar77))
                      ;
                      data_03[uVar57 * 4 + 2] = (stbi__uint16)(int)auVar85._0_4_;
                    }
                    uVar57 = uVar57 + 1;
                  } while ((iVar21 + (int)local_8968) * (iVar55 + uVar40) != uVar57);
                }
              }
              else if (0 < iVar23) {
                uVar57 = 0;
                do {
                  bVar18 = *(byte *)((long)data_03 + uVar57 * 4 + 3);
                  if ((bVar18 != 0) && (bVar18 != 0xff)) {
                    auVar80._0_4_ = (float)(byte)data_03[uVar57 * 2];
                    auVar80._4_12_ = in_register_000014c4;
                    fVar77 = 1.0 / ((float)bVar18 / 255.0);
                    auVar78 = ZEXT416((uint)fVar77);
                    fVar77 = (1.0 - fVar77) * 255.0;
                    auVar85 = vfmadd213ss_fma(auVar80,auVar78,ZEXT416((uint)fVar77));
                    *(char *)(data_03 + uVar57 * 2) = (char)(int)auVar85._0_4_;
                    auVar81._0_4_ = (float)*(byte *)((long)data_03 + uVar57 * 4 + 1);
                    auVar81._4_12_ = in_register_000014c4;
                    auVar85 = vfmadd213ss_fma(auVar81,auVar78,ZEXT416((uint)fVar77));
                    *(char *)((long)data_03 + uVar57 * 4 + 1) = (char)(int)auVar85._0_4_;
                    auVar82._0_4_ = (float)(byte)data_03[uVar57 * 2 + 1];
                    auVar82._4_12_ = in_register_000014c4;
                    auVar85 = vfmadd213ss_fma(auVar82,auVar78,ZEXT416((uint)fVar77));
                    *(char *)(data_03 + uVar57 * 2 + 1) = (char)(int)auVar85._0_4_;
                  }
                  uVar57 = uVar57 + 1;
                } while ((iVar21 + (int)local_8968) * (iVar55 + uVar40) != uVar57);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_03 = stbi__convert_format16(data_03,req_comp,uVar53,uVar49,uVar60);
              }
              else {
                data_03 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_03,4,req_comp,uVar53,uVar49);
              }
              if (data_03 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (local_8940 != (int *)0x0) {
              *local_8940 = 4;
            }
            *local_8948 = uVar49;
            *local_8950 = uVar53;
            return data_03;
          }
          goto LAB_00492f8c;
        }
      }
    }
  }
LAB_00491c19:
  pcVar29 = "too large";
LAB_00491c20:
  *(char **)(in_FS_OFFSET + -0xb0) = pcVar29;
  return (void *)0x0;
LAB_004908d8:
  bVar64 = false;
LAB_004908da:
  if (!bVar64) goto LAB_0049101d;
LAB_004908e2:
  bVar18 = psVar28->marker;
LAB_004908ea:
  if (bVar18 != 0xff) goto LAB_0048f716;
LAB_004908f2:
  do {
    psVar30 = psVar28->s;
    if ((psVar30->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00490912:
      if (psVar30->img_buffer_end <= psVar30->img_buffer) goto LAB_0048f716;
    }
    else {
      iVar21 = (*(psVar30->io).eof)(psVar30->io_user_data);
      if (iVar21 != 0) {
        if (psVar30->read_from_callbacks != 0) goto LAB_00490912;
        goto LAB_0048f716;
      }
    }
    psVar30 = psVar28->s;
    psVar31 = psVar30->img_buffer;
    if (psVar30->img_buffer_end <= psVar31) {
      if (psVar30->read_from_callbacks == 0) goto LAB_004908f2;
      stbi__refill_buffer(psVar30);
      psVar31 = psVar30->img_buffer;
    }
    psVar30->img_buffer = psVar31 + 1;
  } while (*psVar31 != 0xff);
  psVar30 = psVar28->s;
  psVar31 = psVar30->img_buffer;
  if (psVar31 < psVar30->img_buffer_end) {
LAB_00490988:
    psVar30->img_buffer = psVar31 + 1;
    sVar17 = *psVar31;
  }
  else {
    if (psVar30->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar30);
      psVar31 = psVar30->img_buffer;
      goto LAB_00490988;
    }
    sVar17 = '\0';
  }
  psVar28->marker = sVar17;
LAB_0048f716:
  bVar18 = stbi__get_marker(psVar28);
  goto LAB_0048f6c0;
LAB_004920b3:
  psVar28->code_bits = iVar23 + -0x10;
LAB_004920be:
  pcVar29 = "bad huffman code";
LAB_00491014:
  *(char **)(in_FS_OFFSET + -0xb0) = pcVar29;
  goto LAB_0049101d;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}